

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxgeometsc.hpp
# Opt level: O2

number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
computeScalingVec<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *__return_storage_ptr__,soplex *this,
          SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *vecset,vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  *coScaleval,
          vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          *scaleval,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *epsilon)

{
  pointer pnVar1;
  bool bVar2;
  type_conflict5 tVar3;
  double *pdVar4;
  long lVar5;
  long lVar6;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_00;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *pvVar7;
  cpp_dec_float<200U,_int,_void> *pcVar8;
  cpp_dec_float<200U,_int,_void> *pcVar9;
  pointer pnVar10;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar11;
  long *plVar12;
  long lVar13;
  int j;
  long lVar14;
  long lVar15;
  byte bVar16;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  p;
  double local_3c0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<200U,_int,_void> local_338;
  cpp_dec_float<200U,_int,_void> local_2b0;
  cpp_dec_float<200U,_int,_void> local_230;
  undefined1 local_1b0 [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  cpp_dec_float<200U,_int,_void> local_b0;
  
  bVar16 = 0;
  lVar15 = 0;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&__return_storage_ptr__->m_backend,0.0,(type *)0x0);
  do {
    if (*(int *)(this + 0x38) <= lVar15) {
      return __return_storage_ptr__;
    }
    plVar12 = (long *)((long)*(int *)(*(long *)(this + 0x28) + 4 + lVar15 * 8) * 0x28 +
                      *(long *)(this + 0x20));
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&local_230,0.0,(type *)0x0);
    pdVar4 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&local_2b0,*pdVar4,(type *)0x0);
    lVar13 = 0;
    for (lVar14 = 0; lVar14 < *(int *)((long)plVar12 + 0xc); lVar14 = lVar14 + 1) {
      lVar6 = *plVar12;
      local_338.fpclass = cpp_dec_float_finite;
      local_338.prec_elem = 0x1c;
      local_338.data._M_elems[0] = 0;
      local_338.data._M_elems[1] = 0;
      local_338.data._M_elems[2] = 0;
      local_338.data._M_elems[3] = 0;
      local_338.data._M_elems[4] = 0;
      local_338.data._M_elems[5] = 0;
      local_338.data._M_elems[6] = 0;
      local_338.data._M_elems[7] = 0;
      local_338.data._M_elems[8] = 0;
      local_338.data._M_elems[9] = 0;
      local_338.data._M_elems[10] = 0;
      local_338.data._M_elems[0xb] = 0;
      local_338.data._M_elems[0xc] = 0;
      local_338.data._M_elems[0xd] = 0;
      local_338.data._M_elems[0xe] = 0;
      local_338.data._M_elems[0xf] = 0;
      local_338.data._M_elems[0x10] = 0;
      local_338.data._M_elems[0x11] = 0;
      local_338.data._M_elems[0x12] = 0;
      local_338.data._M_elems[0x13] = 0;
      local_338.data._M_elems[0x14] = 0;
      local_338.data._M_elems[0x15] = 0;
      local_338.data._M_elems[0x16] = 0;
      local_338.data._M_elems[0x17] = 0;
      local_338.data._M_elems[0x18] = 0;
      local_338.data._M_elems[0x19] = 0;
      local_338.data._M_elems._104_5_ = 0;
      local_338.data._M_elems[0x1b]._1_3_ = 0;
      local_338.exp = 0;
      local_338.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&local_338,(cpp_dec_float<200U,_int,_void> *)(lVar6 + lVar13),
                 (cpp_dec_float<200U,_int,_void> *)
                 ((vecset->
                  super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  )._vptr_ClassArray + (ulong)*(uint *)(lVar6 + 0x80 + lVar13) * 0x10));
      boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                ((type *)&p.m_backend,(multiprecision *)&local_338,arg);
      lVar6 = 0x1c;
      pcVar8 = &p.m_backend;
      pnVar11 = &local_130;
      for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
        (pnVar11->m_backend).data._M_elems[0] = (pcVar8->data)._M_elems[0];
        pcVar8 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar8 + (ulong)bVar16 * -8 + 4);
        pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar11 + ((ulong)bVar16 * -2 + 1) * 4);
      }
      local_130.m_backend.exp = p.m_backend.exp;
      local_130.m_backend.neg = p.m_backend.neg;
      local_130.m_backend.fpclass = p.m_backend.fpclass;
      local_130.m_backend.prec_elem = p.m_backend.prec_elem;
      pvVar7 = scaleval;
      pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)local_1b0;
      for (; lVar6 != 0; lVar6 = lVar6 + -1) {
        (pnVar11->m_backend).data._M_elems[0] =
             *(uint *)&(pvVar7->
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
        pvVar7 = (vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  *)((long)pvVar7 + (ulong)bVar16 * -8 + 4);
        pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar11 + ((ulong)bVar16 * -2 + 1) * 4);
      }
      local_1b0._112_4_ =
           *(undefined4 *)
            &scaleval[4].
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_1b0[0x74] =
           *(undefined1 *)
            ((long)&scaleval[4].
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
      local_1b0._120_8_ =
           scaleval[5].
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      bVar2 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_130,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)local_1b0);
      if (!bVar2) {
        tVar3 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&p.m_backend,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_230);
        if (tVar3) {
          pcVar8 = &p.m_backend;
          pcVar9 = &local_230;
          for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
            (pcVar9->data)._M_elems[0] = (pcVar8->data)._M_elems[0];
            pcVar8 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar8 + (ulong)bVar16 * -8 + 4);
            pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + ((ulong)bVar16 * -2 + 1) * 4)
            ;
          }
          local_230.exp = p.m_backend.exp;
          local_230.neg = p.m_backend.neg;
          local_230.fpclass = p.m_backend.fpclass;
          local_230.prec_elem = p.m_backend.prec_elem;
        }
        tVar3 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&p.m_backend,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_2b0);
        if (tVar3) {
          pcVar8 = &p.m_backend;
          pcVar9 = &local_2b0;
          for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
            (pcVar9->data)._M_elems[0] = (pcVar8->data)._M_elems[0];
            pcVar8 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar8 + (ulong)bVar16 * -8 + 4);
            pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + ((ulong)bVar16 * -2 + 1) * 4)
            ;
          }
          local_2b0.exp = p.m_backend.exp;
          local_2b0.neg = p.m_backend.neg;
          local_2b0.fpclass = p.m_backend.fpclass;
          local_2b0.prec_elem = p.m_backend.prec_elem;
        }
      }
      lVar13 = lVar13 + 0x84;
    }
    pdVar4 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&p.m_backend,*pdVar4,(type *)0x0);
    bVar2 = boost::multiprecision::operator==
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_2b0,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&p.m_backend);
    if (bVar2) {
LAB_00136e9e:
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&local_2b0,1.0);
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&local_230,1.0);
    }
    else {
      local_b0.data._M_elems[0] = 0;
      local_b0.data._M_elems[1] = 0;
      tVar3 = boost::multiprecision::operator==
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_230,(double *)&local_b0);
      if (tVar3) goto LAB_00136e9e;
    }
    local_3c0 = 1.0;
    result.m_backend.fpclass = cpp_dec_float_finite;
    result.m_backend.prec_elem = 0x1c;
    result.m_backend.data._M_elems[0] = 0;
    result.m_backend.data._M_elems[1] = 0;
    result.m_backend.data._M_elems[2] = 0;
    result.m_backend.data._M_elems[3] = 0;
    result.m_backend.data._M_elems[4] = 0;
    result.m_backend.data._M_elems[5] = 0;
    result.m_backend.data._M_elems[6] = 0;
    result.m_backend.data._M_elems[7] = 0;
    result.m_backend.data._M_elems[8] = 0;
    result.m_backend.data._M_elems[9] = 0;
    result.m_backend.data._M_elems[10] = 0;
    result.m_backend.data._M_elems[0xb] = 0;
    result.m_backend.data._M_elems[0xc] = 0;
    result.m_backend.data._M_elems[0xd] = 0;
    result.m_backend.data._M_elems[0xe] = 0;
    result.m_backend.data._M_elems[0xf] = 0;
    result.m_backend.data._M_elems[0x10] = 0;
    result.m_backend.data._M_elems[0x11] = 0;
    result.m_backend.data._M_elems[0x12] = 0;
    result.m_backend.data._M_elems[0x13] = 0;
    result.m_backend.data._M_elems[0x14] = 0;
    result.m_backend.data._M_elems[0x15] = 0;
    result.m_backend.data._M_elems[0x16] = 0;
    result.m_backend.data._M_elems[0x17] = 0;
    result.m_backend.data._M_elems[0x18] = 0;
    result.m_backend.data._M_elems[0x19] = 0;
    result.m_backend.data._M_elems._104_5_ = 0;
    result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result.m_backend.exp = 0;
    result.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&result.m_backend,&local_2b0,&local_230);
    boost::multiprecision::sqrt<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              ((type *)&local_b0,(multiprecision *)&result.m_backend,arg_00);
    p.m_backend.fpclass = cpp_dec_float_finite;
    p.m_backend.prec_elem = 0x1c;
    p.m_backend.data._M_elems[0] = 0;
    p.m_backend.data._M_elems[1] = 0;
    p.m_backend.data._M_elems[2] = 0;
    p.m_backend.data._M_elems[3] = 0;
    p.m_backend.data._M_elems[4] = 0;
    p.m_backend.data._M_elems[5] = 0;
    p.m_backend.data._M_elems[6] = 0;
    p.m_backend.data._M_elems[7] = 0;
    p.m_backend.data._M_elems[8] = 0;
    p.m_backend.data._M_elems[9] = 0;
    p.m_backend.data._M_elems[10] = 0;
    p.m_backend.data._M_elems[0xb] = 0;
    p.m_backend.data._M_elems[0xc] = 0;
    p.m_backend.data._M_elems[0xd] = 0;
    p.m_backend.data._M_elems[0xe] = 0;
    p.m_backend.data._M_elems[0xf] = 0;
    p.m_backend.data._M_elems[0x10] = 0;
    p.m_backend.data._M_elems[0x11] = 0;
    p.m_backend.data._M_elems[0x12] = 0;
    p.m_backend.data._M_elems[0x13] = 0;
    p.m_backend.data._M_elems[0x14] = 0;
    p.m_backend.data._M_elems[0x15] = 0;
    p.m_backend.data._M_elems[0x16] = 0;
    p.m_backend.data._M_elems[0x17] = 0;
    p.m_backend.data._M_elems[0x18] = 0;
    p.m_backend.data._M_elems[0x19] = 0;
    p.m_backend.data._M_elems._104_5_ = 0;
    p.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    p.m_backend.exp = 0;
    p.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
              (&p.m_backend,&local_3c0,&local_b0);
    pnVar1 = (coScaleval->
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pcVar8 = &p.m_backend;
    pnVar10 = pnVar1 + lVar15;
    for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
      (pnVar10->m_backend).data._M_elems[0] = (pcVar8->data)._M_elems[0];
      pcVar8 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar8 + (ulong)bVar16 * -8 + 4);
      pnVar10 = (pointer)((long)pnVar10 + ((ulong)bVar16 * -2 + 1) * 4);
    }
    pnVar1[lVar15].m_backend.exp = p.m_backend.exp;
    pnVar1[lVar15].m_backend.neg = p.m_backend.neg;
    pnVar1[lVar15].m_backend.fpclass = p.m_backend.fpclass;
    pnVar1[lVar15].m_backend.prec_elem = p.m_backend.prec_elem;
    p.m_backend.fpclass = cpp_dec_float_finite;
    p.m_backend.prec_elem = 0x1c;
    p.m_backend.data._M_elems[0] = 0;
    p.m_backend.data._M_elems[1] = 0;
    p.m_backend.data._M_elems[2] = 0;
    p.m_backend.data._M_elems[3] = 0;
    p.m_backend.data._M_elems[4] = 0;
    p.m_backend.data._M_elems[5] = 0;
    p.m_backend.data._M_elems[6] = 0;
    p.m_backend.data._M_elems[7] = 0;
    p.m_backend.data._M_elems[8] = 0;
    p.m_backend.data._M_elems[9] = 0;
    p.m_backend.data._M_elems[10] = 0;
    p.m_backend.data._M_elems[0xb] = 0;
    p.m_backend.data._M_elems[0xc] = 0;
    p.m_backend.data._M_elems[0xd] = 0;
    p.m_backend.data._M_elems[0xe] = 0;
    p.m_backend.data._M_elems[0xf] = 0;
    p.m_backend.data._M_elems[0x10] = 0;
    p.m_backend.data._M_elems[0x11] = 0;
    p.m_backend.data._M_elems[0x12] = 0;
    p.m_backend.data._M_elems[0x13] = 0;
    p.m_backend.data._M_elems[0x14] = 0;
    p.m_backend.data._M_elems[0x15] = 0;
    p.m_backend.data._M_elems[0x16] = 0;
    p.m_backend.data._M_elems[0x17] = 0;
    p.m_backend.data._M_elems[0x18] = 0;
    p.m_backend.data._M_elems[0x19] = 0;
    p.m_backend.data._M_elems._104_5_ = 0;
    p.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    p.m_backend.exp = 0;
    p.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&p.m_backend,&local_230,&local_2b0);
    tVar3 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&p.m_backend,__return_storage_ptr__);
    if (tVar3) {
      pcVar8 = &p.m_backend;
      pnVar11 = __return_storage_ptr__;
      for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
        (pnVar11->m_backend).data._M_elems[0] = (pcVar8->data)._M_elems[0];
        pcVar8 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar8 + (ulong)bVar16 * -8 + 4);
        pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar11 + ((ulong)bVar16 * -2 + 1) * 4);
      }
      (__return_storage_ptr__->m_backend).exp = p.m_backend.exp;
      (__return_storage_ptr__->m_backend).neg = p.m_backend.neg;
      (__return_storage_ptr__->m_backend).fpclass = p.m_backend.fpclass;
      (__return_storage_ptr__->m_backend).prec_elem = p.m_backend.prec_elem;
    }
    lVar15 = lVar15 + 1;
  } while( true );
}

Assistant:

static R computeScalingVec(
   const SVSetBase<R>*   vecset, const std::vector<R>& coScaleval,
   std::vector<R>&       scaleval, R epsilon)
{
   R pmax = 0.0;

   assert(scaleval.size() == unsigned(vecset->num()));

   for(int i = 0; i < vecset->num(); ++i)
   {
      const SVectorBase<R>& vec = (*vecset)[i];

      R maxi = 0.0;
      R mini = R(infinity);

      for(int j = 0; j < vec.size(); ++j)
      {
         const R x = spxAbs(vec.value(j) * coScaleval[unsigned(vec.index(j))]);

         if(!isZero(x, epsilon))
         {
            if(x > maxi)
               maxi = x;

            if(x < mini)
               mini = x;
         }
      }

      // empty rows/cols are possible
      if(mini == R(infinity) || maxi == 0.0)
      {
         mini = 1.0;
         maxi = 1.0;
      }

      assert(mini < R(infinity));
      assert(maxi > 0.0);

      scaleval[unsigned(i)] = 1.0 / spxSqrt(mini * maxi);

      const R p = maxi / mini;

      if(p > pmax)
         pmax = p;
   }

   return pmax;
}